

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void pushpop_inuse_regs(dill_stream c,int pop,virtual_insn *ip)

{
  arg_info_list paVar1;
  private_ctx pdVar2;
  long lVar3;
  long lVar4;
  
  pdVar2 = c->p;
  if (0 < pdVar2->c_param_count) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      paVar1 = pdVar2->c_param_args;
      if ((&paVar1->is_register)[lVar4] != '\0') {
        (*c->j->save_restore)
                  (c,pop,(int)(&paVar1->type)[lVar4],*(int *)((long)&paVar1->in_reg + lVar4));
      }
      lVar3 = lVar3 + 1;
      pdVar2 = c->p;
      lVar4 = lVar4 + 0x14;
    } while (lVar3 < pdVar2->c_param_count);
  }
  return;
}

Assistant:

static void
pushpop_inuse_regs(dill_stream c, int pop, virtual_insn* ip)
{
    int i = 0;
    /* no actual reg assigns, so only the params are in use */
    for (i = 0; i < c->p->c_param_count; i++) {
        if (c->p->c_param_args[i].is_register) {
            c->j->save_restore(c, pop, c->p->c_param_args[i].type,
                               c->p->c_param_args[i].in_reg);
        }
    }
}